

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

void clusterRemoval(Mat *image,int threshold)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  uchar *puVar5;
  size_type sVar6;
  reference pmVar7;
  Point_<int> local_1e8;
  Point_<int> local_1e0;
  mPoint point_1;
  iterator __end4;
  iterator __begin4;
  set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *__range4;
  Point_<int> local_1b8;
  mPoint point;
  iterator __end5;
  iterator __begin5;
  set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *__range5;
  undefined1 local_138 [8];
  set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> cluster;
  int local_fc;
  int local_f8;
  int y_1;
  int x_1;
  int local_ec;
  int local_e8;
  int y;
  int x;
  Mat local_d8 [8];
  Mat out;
  int local_cc;
  Mat local_78 [8];
  Mat temp;
  int local_6c;
  int threshold_local;
  Mat *image_local;
  
  cv::Mat::clone();
  iVar1 = *(int *)(image + 8);
  iVar2 = *(int *)(image + 0xc);
  iVar4 = cv::Mat::type(image);
  cv::Mat::Mat(local_d8,iVar1,iVar2,iVar4);
  for (local_e8 = 0; local_e8 < local_cc; local_e8 = local_e8 + 1) {
    for (local_ec = 0; local_ec < _out; local_ec = local_ec + 1) {
      cv::Point_<int>::Point_((Point_<int> *)&y_1,local_e8,local_ec);
      puVar5 = cv::Mat::at<unsigned_char>(local_d8,(Point *)&y_1);
      *puVar5 = '\0';
    }
  }
  for (local_f8 = 0; local_f8 < local_6c; local_f8 = local_f8 + 1) {
    for (local_fc = 0; local_fc < _temp; local_fc = local_fc + 1) {
      cv::Point_<int>::Point_
                ((Point_<int> *)
                 ((long)&cluster._M_t._M_impl.super__Rb_tree_header._M_node_count + 4),local_f8,
                 local_fc);
      puVar5 = cv::Mat::at<unsigned_char>
                         (local_78,(Point *)((long)&cluster._M_t._M_impl.super__Rb_tree_header.
                                                    _M_node_count + 4));
      if (*puVar5 == 0xff) {
        cv::Mat::Mat((Mat *)&__range5,local_78);
        findCluster((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)local_138,
                    (Mat *)&__range5,local_f8,local_fc);
        cv::Mat::~Mat((Mat *)&__range5);
        sVar6 = std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::size
                          ((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)local_138);
        if ((ulong)(long)threshold < sVar6) {
          __end5 = std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::begin
                             ((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)local_138);
          point.super_Point =
               (Point)std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::end
                                ((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)
                                 local_138);
          while (bVar3 = std::operator!=(&__end5,(_Self *)&point), bVar3) {
            pmVar7 = std::_Rb_tree_const_iterator<mPoint>::operator*(&__end5);
            mPoint::mPoint((mPoint *)&local_1b8,pmVar7);
            cv::Point_<int>::Point_((Point_<int> *)&__range4,&local_1b8);
            puVar5 = cv::Mat::at<unsigned_char>(local_d8,(Point *)&__range4);
            *puVar5 = 0xff;
            std::_Rb_tree_const_iterator<mPoint>::operator++(&__end5);
          }
        }
        __end4 = std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::begin
                           ((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)local_138);
        point_1.super_Point =
             (Point)std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::end
                              ((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)local_138)
        ;
        while (bVar3 = std::operator!=(&__end4,(_Self *)&point_1), bVar3) {
          pmVar7 = std::_Rb_tree_const_iterator<mPoint>::operator*(&__end4);
          mPoint::mPoint((mPoint *)&local_1e0,pmVar7);
          cv::Point_<int>::Point_(&local_1e8,&local_1e0);
          puVar5 = cv::Mat::at<unsigned_char>(local_78,&local_1e8);
          *puVar5 = '\0';
          std::_Rb_tree_const_iterator<mPoint>::operator++(&__end4);
        }
        std::set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_>::~set
                  ((set<mPoint,_std::less<mPoint>,_std::allocator<mPoint>_> *)local_138);
      }
    }
  }
  cv::Mat::operator=(image,local_d8);
  cv::Mat::~Mat(local_d8);
  cv::Mat::~Mat(local_78);
  return;
}

Assistant:

void clusterRemoval(cv::Mat & image, int threshold) {
	cv::Mat temp = image.clone();
	cv::Mat out = cv::Mat(image.rows, image.cols, image.type());
	for (int x = 0; x < out.cols; x++)
		for (int y = 0; y < out.rows; y++)
			out.at<uchar>(cv::Point(x, y)) = 0;
	for (int x = 0; x < temp.cols; x++) {
		for (int y = 0; y < temp.rows; y++) {
			if (temp.at<uchar>(cv::Point(x, y)) == UCHAR_MAX) {
				std::set<mPoint> cluster = findCluster(temp, x, y);
				if (cluster.size() > threshold) {
					for (auto point : cluster) {
						out.at<uchar>(point) = UCHAR_MAX;
					}
				}
				for (auto point : cluster) {
					temp.at<uchar>(point) = 0;
				}
			}
		}
	}
	image = out;
}